

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void api_suite::api_false(void)

{
  char input [6];
  decoder_type decoder;
  value_type local_148 [8];
  undefined4 local_140;
  value local_13c;
  basic_decoder<char> local_138;
  
  local_138.input.tail = local_148 + 5;
  builtin_memcpy(local_148,"false",6);
  local_138.input.head = local_148;
  memset(&local_138.current,0,0x120);
  local_138.current.code = uninitialized;
  local_138.current.view.head = (const_pointer)0x0;
  local_138.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_138);
  local_13c = local_138.current.code;
  local_140 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::false_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x37,"void api_suite::api_false()",&local_13c,&local_140);
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}